

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O1

LY_ERR lys_compile_type_pattern_check(ly_ctx *ctx,char *pattern,pcre2_code_8 **code)

{
  byte bVar1;
  undefined *puVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *__haystack;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  long lVar10;
  pcre2_code_8 *ppVar11;
  LY_ERR LVar12;
  long lVar13;
  byte *pbVar14;
  ulong uVar15;
  char *__haystack_00;
  int err_code;
  size_t err_offset;
  PCRE2_UCHAR8 err_msg [256];
  char *pcVar16;
  undefined4 local_164;
  char *local_160;
  char *local_158;
  pcre2_code_8 **local_150;
  char *local_148;
  long local_140;
  char local_138 [264];
  
  sVar6 = strlen(pattern);
  sVar6 = sVar6 + 1;
  __haystack = (char *)malloc(sVar6);
  if (__haystack == (char *)0x0) {
LAB_00146f46:
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_type_pattern_check")
    ;
    return LY_EMEM;
  }
  *__haystack = '\0';
  lVar7 = 0;
  lVar13 = 0;
  pbVar14 = (byte *)pattern;
  local_150 = code;
  do {
    bVar4 = false;
    for (; bVar1 = *pbVar14, bVar1 == 0x5c; pbVar14 = pbVar14 + 1) {
      bVar4 = (bool)(bVar4 ^ 1);
      __haystack[lVar13] = '\\';
      lVar13 = lVar13 + 1;
    }
    if (bVar1 < 0x5b) {
      if (bVar1 == 0) {
        __haystack[lVar13] = '\0';
        pcVar8 = strstr(__haystack,"\\p{Is");
        bVar4 = true;
        pcVar16 = __haystack;
        if (pcVar8 != (char *)0x0) break;
        LVar12 = LY_SUCCESS;
        goto LAB_00146faa;
      }
      if (bVar1 == 0x24) {
LAB_00146d08:
        if (lVar7 == 0) {
          sVar6 = sVar6 + 1;
          __haystack = (char *)ly_realloc(__haystack,sVar6);
          if (__haystack == (char *)0x0) goto LAB_00146f46;
          __haystack[lVar13] = '\\';
          lVar13 = lVar13 + 1;
          lVar7 = 0;
        }
      }
    }
    else if (bVar1 == 0x5b) {
      lVar7 = lVar7 + (ulong)!bVar4;
    }
    else if (bVar1 == 0x5d) {
      if (!bVar4 && lVar7 == 0) {
        pcVar16 = "character group doesn\'t begin with \'[\'";
        goto LAB_0014703f;
      }
      lVar7 = lVar7 - (ulong)!bVar4;
    }
    else if (bVar1 == 0x5e) goto LAB_00146d08;
    __haystack[lVar13] = *pbVar14;
    lVar13 = lVar13 + 1;
    pbVar14 = pbVar14 + 1;
  } while( true );
  do {
    lVar7 = (long)pcVar8 - (long)pcVar16;
    pcVar9 = strchr(pcVar8,0x7d);
    if (pcVar9 == (char *)0x0) {
      pcVar8 = pcVar16 + lVar7 + 2;
      pcVar16 = "unterminated character property";
LAB_00146f98:
      ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
              "Regular expression \"%s\" is not valid (\"%s\": %s).",pattern,pcVar8,pcVar16);
      bVar4 = false;
      LVar12 = LY_EVALID;
      goto LAB_00146faa;
    }
    uVar15 = (long)(pcVar9 + (1 - (long)pcVar16)) - lVar7;
    __haystack_00 = pcVar16;
    local_158 = pcVar16;
    local_148 = pcVar8;
    if (uVar15 < 0x13) {
      sVar6 = strlen(pcVar16);
      __haystack = (char *)ly_realloc(pcVar16,(sVar6 - uVar15) + 0x14);
      __haystack_00 = __haystack;
      if (__haystack == (char *)0x0) {
        LVar12 = LY_EMEM;
        ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
               "lys_compile_pattern_chblocks_xmlschema2perl");
        bVar4 = false;
        goto LAB_00146faa;
      }
    }
    pcVar8 = __haystack_00 + lVar7 + 5;
    local_160 = pcVar9 + (1 - (long)pcVar16);
    iVar5 = strncmp(pcVar8,"BasicLatin",10);
    if (iVar5 != 0) {
      lVar13 = 0x10;
      do {
        if (lVar13 + 0x10 == 0x550) goto LAB_00146f6f;
        pcVar16 = *(char **)((long)&PTR_anon_var_dwarf_6cc48_002039d0 + lVar13);
        sVar6 = strlen(pcVar16);
        iVar5 = strncmp(pcVar8,pcVar16,sVar6);
        lVar13 = lVar13 + 0x10;
      } while (iVar5 != 0);
      if (pcVar16 == (char *)0x0) {
LAB_00146f6f:
        pcVar16 = "unknown block name";
        goto LAB_00146f98;
      }
    }
    if (local_148 == local_158) {
      lVar13 = 0;
    }
    else {
      lVar13 = 0;
      lVar10 = 0;
      do {
        if ((__haystack_00[lVar10] == '[') &&
           ((lVar10 == 0 || (__haystack_00[lVar10 + -1] != '\\')))) {
          lVar13 = lVar13 + 1;
        }
        if ((__haystack_00[lVar10] == ']') &&
           ((lVar10 == 0 || (__haystack_00[lVar10 + -1] != '\\')))) {
          lVar13 = lVar13 + -1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar7 != lVar10);
    }
    pcVar16 = __haystack_00 + lVar7;
    pcVar8 = __haystack_00 + (long)local_160;
    sVar6 = strlen(pcVar8);
    if (lVar13 == 0) {
      memmove(pcVar16 + 0x13,pcVar8,sVar6 + 1);
      builtin_strncpy(__haystack_00 + lVar7,"[\\x{0000}-\\x{007F}]",0x13);
    }
    else {
      memmove(pcVar16 + 0x11,pcVar8,sVar6 + 1);
      puVar2 = (&PTR_anon_var_dwarf_6cc53_002039d8)[lVar13 * 2];
      uVar3 = *(undefined8 *)(puVar2 + 9);
      *(undefined8 *)pcVar16 = *(undefined8 *)(puVar2 + 1);
      *(undefined8 *)(pcVar16 + 8) = uVar3;
      pcVar16[0x10] = puVar2[0x11];
    }
    pcVar8 = strstr(__haystack_00,"\\p{Is");
    pcVar16 = __haystack_00;
  } while (pcVar8 != (char *)0x0);
  LVar12 = LY_SUCCESS;
  bVar4 = true;
LAB_00146faa:
  if (bVar4) {
    ppVar11 = (pcre2_code_8 *)
              pcre2_compile_8(__haystack,0xffffffffffffffff,0xa00a2010,&local_164,&local_140,0);
    if (ppVar11 == (pcre2_code_8 *)0x0) {
      pcVar16 = local_138;
      memset(pcVar16,0,0x100);
      pcre2_get_error_message_8(local_164,pcVar16,0x100);
      pbVar14 = (byte *)(__haystack + local_140);
LAB_0014703f:
      ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
              "Regular expression \"%s\" is not valid (\"%s\": %s).",pattern,pbVar14,pcVar16);
      free(__haystack);
      LVar12 = LY_EVALID;
    }
    else {
      free(__haystack);
      if (local_150 == (pcre2_code_8 **)0x0) {
        pcre2_code_free_8(ppVar11);
      }
      else {
        *local_150 = ppVar11;
      }
      LVar12 = LY_SUCCESS;
    }
  }
  else {
    free(__haystack);
  }
  return LVar12;
}

Assistant:

LY_ERR
lys_compile_type_pattern_check(const struct ly_ctx *ctx, const char *pattern, pcre2_code **code)
{
    size_t idx, size, brack;
    char *perl_regex;
    int err_code, compile_opts;
    const char *orig_ptr;
    PCRE2_SIZE err_offset;
    pcre2_code *code_local;
    ly_bool escaped;
    LY_ERR r;

    /* adjust the expression to a Perl equivalent
     * http://www.w3.org/TR/2004/REC-xmlschema-2-20041028/#regexs */

    /* allocate space for the transformed pattern */
    size = strlen(pattern) + 1;
    compile_opts = PCRE2_UTF | PCRE2_UCP | PCRE2_ANCHORED | PCRE2_DOLLAR_ENDONLY | PCRE2_NO_AUTO_CAPTURE;
#ifdef PCRE2_ENDANCHORED
    compile_opts |= PCRE2_ENDANCHORED;
#else
    /* add space for trailing $ anchor */
    size++;
#endif
    perl_regex = malloc(size);
    LY_CHECK_ERR_RET(!perl_regex, LOGMEM(ctx), LY_EMEM);
    perl_regex[0] = '\0';

    /* we need to replace all "$" and "^" (that are not in "[]") with "\$" and "\^" */
    brack = 0;
    idx = 0;
    escaped = 0;
    orig_ptr = pattern;
    while (orig_ptr[0]) {
        switch (orig_ptr[0]) {
        case '$':
        case '^':
            if (!brack) {
                /* make space for the extra character */
                ++size;
                perl_regex = ly_realloc(perl_regex, size);
                LY_CHECK_ERR_RET(!perl_regex, LOGMEM(ctx), LY_EMEM);

                /* print escape slash */
                perl_regex[idx] = '\\';
                ++idx;
            }
            break;
        case '\\':
            /*  escape character found or backslash is escaped */
            escaped = !escaped;
            /* copy backslash and continue with the next character */
            perl_regex[idx] = orig_ptr[0];
            ++idx;
            ++orig_ptr;
            continue;
        case '[':
            if (!escaped) {
                ++brack;
            }
            break;
        case ']':
            if (!brack && !escaped) {
                /* If ']' does not terminate a character class expression, then pcre2_compile() implicitly escapes the
                 * ']' character. But this seems to be against the regular expressions rules declared in
                 * "XML schema: Datatypes" and therefore an error is returned. So for example if pattern is '\[a]' then
                 * pcre2 match characters '[a]' literally but in YANG such pattern is not allowed.
                 */
                LOGVAL(ctx, LY_VCODE_INREGEXP, pattern, orig_ptr, "character group doesn't begin with '['");
                free(perl_regex);
                return LY_EVALID;
            } else if (!escaped) {
                --brack;
            }
            break;
        default:
            break;
        }

        /* copy char */
        perl_regex[idx] = orig_ptr[0];

        ++idx;
        ++orig_ptr;
        escaped = 0;
    }
#ifndef PCRE2_ENDANCHORED
    /* anchor match to end of subject */
    perl_regex[idx++] = '$';
#endif
    perl_regex[idx] = '\0';

    /* transform character blocks */
    if ((r = lys_compile_pattern_chblocks_xmlschema2perl(ctx, pattern, &perl_regex))) {
        free(perl_regex);
        return r;
    }

    /* must return 0, already checked during parsing */
    code_local = pcre2_compile((PCRE2_SPTR)perl_regex, PCRE2_ZERO_TERMINATED, compile_opts,
            &err_code, &err_offset, NULL);
    if (!code_local) {
        PCRE2_UCHAR err_msg[LY_PCRE2_MSG_LIMIT] = {0};

        pcre2_get_error_message(err_code, err_msg, LY_PCRE2_MSG_LIMIT);
        LOGVAL(ctx, LY_VCODE_INREGEXP, pattern, perl_regex + err_offset, err_msg);
        free(perl_regex);
        return LY_EVALID;
    }
    free(perl_regex);

    if (code) {
        *code = code_local;
    } else {
        pcre2_code_free(code_local);
    }

    return LY_SUCCESS;

#undef URANGE_LEN
}